

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O0

void polynomial_build_exp_lut
               (field_t field,field_element_t val,uint order,field_logarithm_t *val_exp)

{
  field_logarithm_t r;
  field_t field_00;
  uint in_ECX;
  byte in_DL;
  field_logarithm_t *in_RSI;
  field_element_t *in_RDI;
  long in_R8;
  uint i;
  field_logarithm_t val_log;
  field_logarithm_t val_exponentiated;
  uint local_28;
  field_logarithm_t local_21;
  
  local_21 = in_RSI[1];
  r = in_RSI[in_DL];
  for (local_28 = 0; local_28 <= in_ECX; local_28 = local_28 + 1) {
    if (in_DL == 0) {
      *(undefined1 *)(in_R8 + (ulong)local_28) = 0;
    }
    else {
      *(field_logarithm_t *)(in_R8 + (ulong)local_28) = local_21;
      field_00.log = in_RSI;
      field_00.exp = in_RDI;
      local_21 = field_mul_log(field_00,local_21,r);
    }
  }
  return;
}

Assistant:

void polynomial_build_exp_lut(field_t field, field_element_t val, unsigned int order, field_logarithm_t *val_exp) {
    // create the lookup table of successive powers of val used by polynomial_eval_lut
    field_logarithm_t val_exponentiated = field.log[1];
    field_logarithm_t val_log = field.log[val];
    for (unsigned int i = 0; i <= order; i++) {
        if (val == 0) {
            val_exp[i] = 0;
        } else {
            val_exp[i] = val_exponentiated;
            val_exponentiated = field_mul_log(field, val_exponentiated, val_log);
        }
    }
}